

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_bds.cpp
# Opt level: O0

void BDS::ComputeAofs(MultiFab *aofs,int aofs_comp,int ncomp,MultiFab *state,int state_comp,
                     MultiFab *umac,MultiFab *vmac,MultiFab *wmac,MultiFab *xedge,MultiFab *yedge,
                     MultiFab *zedge,int edge_comp,bool known_edgestate,MultiFab *xfluxes,
                     MultiFab *yfluxes,MultiFab *zfluxes,int fluxes_comp,MultiFab *fq,int fq_comp,
                     MultiFab *divu,BCRec *d_bc,Geometry *geom,
                     Vector<int,_std::allocator<int>_> *iconserv,Real dt,bool is_velocity)

{
  bool bVar1;
  iterator piVar2;
  BoxArray *l_dt;
  Array4<double> *zedge_00;
  Long LVar3;
  int *piVar4;
  reference ppMVar5;
  FabArrayBase *in_RCX;
  long lVar6;
  Array4<const_double> *pAVar7;
  undefined8 *puVar8;
  value_type in_R9;
  byte bVar9;
  value_type in_stack_00000008;
  value_type in_stack_00000010;
  byte in_stack_00000038;
  void *in_stack_00000080;
  byte in_stack_00000090;
  Array4<double> *divu_arr;
  Array4<double> *aofs_arr;
  Real mult;
  Array4<const_double> *w;
  Array4<const_double> *v;
  Array4<const_double> *u_1;
  Array4<double> *zed;
  Array4<double> *yed;
  Array4<double> *xed;
  Array4<double> *fz;
  Array4<double> *fy;
  Array4<double> *fx;
  Box *bx;
  MFIter mfi;
  Array<const_MultiFab_*,_3> u;
  Long i;
  MultiFab divu_mac;
  int *iconserv_ptr;
  DeviceVector<int> iconserv_d;
  bool fluxes_are_area_weighted;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff2f8;
  MFIter *in_stack_fffffffffffff300;
  int start_comp;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff308;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff310;
  undefined4 in_stack_fffffffffffff320;
  undefined4 in_stack_fffffffffffff324;
  undefined1 uVar10;
  int in_stack_fffffffffffff328;
  int in_stack_fffffffffffff32c;
  MFIter *in_stack_fffffffffffff330;
  BoxArray *in_stack_fffffffffffff338;
  anon_class_328_6_9351cb96 *in_stack_fffffffffffff340;
  int in_stack_fffffffffffff34c;
  Box *in_stack_fffffffffffff350;
  MFIter *in_stack_fffffffffffff360;
  Array4<double> *pAVar11;
  Array4<double> *mult_00;
  Box *pBVar12;
  int ncomp_00;
  Array4<const_double> *fz_00;
  MFIter *in_stack_fffffffffffff478;
  Array4<const_double> *in_stack_fffffffffffff480;
  Array4<const_double> *in_stack_fffffffffffff488;
  Box *in_stack_fffffffffffff490;
  undefined8 *puVar13;
  Array4<double> *yedge_00;
  Array4<double> *in_stack_fffffffffffff538;
  Geometry *in_stack_fffffffffffff540;
  undefined4 in_stack_fffffffffffff548;
  int in_stack_fffffffffffff54c;
  Box *in_stack_fffffffffffff550;
  undefined1 auStack_a80 [64];
  undefined1 auStack_a40 [64];
  undefined1 auStack_a00 [64];
  undefined1 auStack_9c0 [47];
  undefined1 in_stack_fffffffffffff66f;
  Array4<const_double> *in_stack_fffffffffffff670;
  Array4<const_double> *in_stack_fffffffffffff678;
  Array4<double> *in_stack_fffffffffffff680;
  Array4<double> *in_stack_fffffffffffff688;
  Array4<double> *in_stack_fffffffffffff690;
  Box *in_stack_fffffffffffff698;
  undefined1 local_938 [64];
  undefined1 *local_8f8;
  Array4<const_double> local_8f0;
  Array4<const_double> local_8b0;
  Array4<const_double> *in_stack_fffffffffffff790;
  Array4<const_double> *in_stack_fffffffffffff798;
  Array4<const_double> *in_stack_fffffffffffff7a0;
  Array4<const_double> *in_stack_fffffffffffff7a8;
  Array4<const_double> *in_stack_fffffffffffff7b0;
  Geometry in_stack_fffffffffffff7b8;
  undefined8 in_stack_fffffffffffff880;
  undefined8 in_stack_fffffffffffff888;
  element_type *in_stack_fffffffffffff8a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffff8a8;
  Array4<const_double> *in_stack_fffffffffffff8b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffff8b8;
  Geometry *in_stack_fffffffffffff8c0;
  int in_stack_fffffffffffff8c8;
  Array4<const_double> local_728 [6];
  undefined1 local_5a0 [64];
  undefined1 *local_560;
  Array4<const_double> local_558;
  Array4<const_double> *local_518;
  Box local_510 [2];
  Box *local_4d0;
  Array4<double> local_4c8;
  Array4<double> *local_488;
  Array4<double> local_480;
  Array4<double> *local_440;
  Array4<double> local_438;
  Array4<double> *local_3f8;
  Array4<double> local_3f0;
  Array4<double> *local_3b0;
  Array4<double> local_3a8;
  Array4<double> *local_368;
  Array4<double> local_360;
  Array4<double> *local_320;
  undefined1 local_314 [28];
  undefined1 *local_2f8;
  MFIter local_2f0;
  long local_278;
  undefined8 local_260;
  Array4<double> local_258 [6];
  Array4<double> *local_b0;
  int *local_a8;
  int *local_a0;
  PODVector<int,_std::allocator<int>_> local_90;
  byte local_72;
  byte local_71;
  byte local_61;
  value_type local_60;
  FabArrayBase *local_50;
  
  bVar9 = 0;
  local_61 = in_stack_00000038 & 1;
  local_71 = in_stack_00000090 & 1;
  local_72 = 1;
  local_60 = in_R9;
  local_50 = in_RCX;
  amrex::Vector<int,_std::allocator<int>_>::size((Vector<int,_std::allocator<int>_> *)0x6c601f);
  amrex::PODVector<int,_std::allocator<int>_>::PODVector
            ((PODVector<int,_std::allocator<int>_> *)in_stack_fffffffffffff300,
             (size_type)in_stack_fffffffffffff2f8);
  local_a0 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffff2f8);
  local_a8 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffff2f8);
  piVar2 = amrex::PODVector<int,_std::allocator<int>_>::begin(&local_90);
  amrex::Gpu::copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*>
            (local_a0,local_a8,piVar2);
  local_b0 = (Array4<double> *)amrex::PODVector<int,_std::allocator<int>_>::data(&local_90);
  l_dt = amrex::FabArrayBase::boxArray(local_50);
  zedge_00 = (Array4<double> *)amrex::FabArrayBase::DistributionMap(local_50);
  local_258[0].kstride = 0;
  local_258[0].nstride = 0;
  local_258[0].p = (double *)0x0;
  local_258[0].jstride = 0;
  local_258[0].begin.x = 0;
  local_258[0].begin.y = 0;
  yedge_00 = local_258;
  amrex::MFInfo::MFInfo((MFInfo *)0x6c60f9);
  local_260 = 0;
  puVar8 = &local_260;
  amrex::DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff300);
  puVar13 = puVar8;
  amrex::MultiFab::MultiFab
            ((MultiFab *)in_stack_fffffffffffff340,in_stack_fffffffffffff338,
             (DistributionMapping *)in_stack_fffffffffffff330,in_stack_fffffffffffff32c,
             in_stack_fffffffffffff328,
             (MFInfo *)CONCAT44(in_stack_fffffffffffff324,in_stack_fffffffffffff320),
             (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff350);
  amrex::DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)0x6c6164);
  amrex::MFInfo::~MFInfo((MFInfo *)0x6c6171);
  local_278 = 0;
  do {
    lVar6 = local_278;
    LVar3 = amrex::Vector<int,_std::allocator<int>_>::size
                      ((Vector<int,_std::allocator<int>_> *)0x6c619a);
    uVar10 = (undefined1)((uint)in_stack_fffffffffffff324 >> 0x18);
    if (LVar3 <= lVar6) {
LAB_006c62e2:
      amrex::TilingIfNotGPU();
      amrex::MFIter::MFIter
                (in_stack_fffffffffffff330,
                 (FabArrayBase *)CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328),
                 (bool)uVar10);
      while( true ) {
        bVar1 = amrex::MFIter::isValid(&local_2f0);
        if (!bVar1) break;
        amrex::MFIter::tilebox(in_stack_fffffffffffff360);
        local_2f8 = local_314;
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffff310,(MFIter *)in_stack_fffffffffffff308,
                   (int)((ulong)in_stack_fffffffffffff300 >> 0x20));
        local_320 = &local_360;
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffff310,(MFIter *)in_stack_fffffffffffff308,
                   (int)((ulong)in_stack_fffffffffffff300 >> 0x20));
        local_368 = &local_3a8;
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffff310,(MFIter *)in_stack_fffffffffffff308,
                   (int)((ulong)in_stack_fffffffffffff300 >> 0x20));
        local_3b0 = &local_3f0;
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffff310,(MFIter *)in_stack_fffffffffffff308,
                   (int)((ulong)in_stack_fffffffffffff300 >> 0x20));
        local_3f8 = &local_438;
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffff310,(MFIter *)in_stack_fffffffffffff308,
                   (int)((ulong)in_stack_fffffffffffff300 >> 0x20));
        local_440 = &local_480;
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffff310,(MFIter *)in_stack_fffffffffffff308,
                   (int)((ulong)in_stack_fffffffffffff300 >> 0x20));
        local_488 = &local_4c8;
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffff308,in_stack_fffffffffffff300);
        local_4d0 = local_510;
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffff308,in_stack_fffffffffffff300);
        local_518 = &local_558;
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffff308,in_stack_fffffffffffff300);
        local_560 = local_5a0;
        if ((local_61 & 1) == 0) {
          in_stack_fffffffffffff478 = &local_2f0;
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (in_stack_fffffffffffff310,(MFIter *)in_stack_fffffffffffff308,
                     (int)((ulong)in_stack_fffffffffffff300 >> 0x20));
          in_stack_fffffffffffff488 = local_518;
          in_stack_fffffffffffff490 = local_4d0;
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (in_stack_fffffffffffff308,in_stack_fffffffffffff300);
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (in_stack_fffffffffffff310,(MFIter *)in_stack_fffffffffffff308,
                     (int)((ulong)in_stack_fffffffffffff300 >> 0x20));
          in_stack_fffffffffffff480 = local_728;
          memcpy(in_stack_fffffffffffff480,in_stack_00000080,200);
          pAVar7 = in_stack_fffffffffffff480;
          puVar8 = (undefined8 *)&stack0xfffffffffffff320;
          for (lVar6 = 0x19; lVar6 != 0; lVar6 = lVar6 + -1) {
            *puVar8 = pAVar7->p;
            pAVar7 = (Array4<const_double> *)((long)pAVar7 + (ulong)bVar9 * -0x10 + 8);
            puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
          }
          ComputeEdgeState(in_stack_fffffffffffff550,in_stack_fffffffffffff54c,
                           (Array4<const_double> *)in_stack_fffffffffffff540,
                           in_stack_fffffffffffff538,yedge_00,zedge_00,in_stack_fffffffffffff790,
                           in_stack_fffffffffffff798,in_stack_fffffffffffff7a0,
                           in_stack_fffffffffffff7a8,in_stack_fffffffffffff7b0,
                           in_stack_fffffffffffff7b8,(Real)l_dt,(BCRec *)in_stack_fffffffffffff880,
                           (int *)in_stack_fffffffffffff888,SUB81((ulong)puVar13 >> 0x38,0));
        }
        pAVar7 = (Array4<const_double> *)&stack0xfffffffffffff890;
        pAVar11 = local_368;
        mult_00 = local_3b0;
        pBVar12 = local_4d0;
        fz_00 = local_518;
        amrex::Array4<const_double>::Array4<const_double,_0>(pAVar7,local_3f8);
        ncomp_00 = (int)((ulong)pBVar12 >> 0x20);
        uVar10 = (undefined1)((ulong)pAVar11 >> 0x38);
        in_stack_fffffffffffff308 = (FabArray<amrex::FArrayBox> *)&stack0xfffffffffffff850;
        amrex::Array4<const_double>::Array4<const_double,_0>
                  ((Array4<const_double> *)in_stack_fffffffffffff308,local_440);
        in_stack_fffffffffffff310 = (FabArray<amrex::FArrayBox> *)&stack0xfffffffffffff810;
        amrex::Array4<const_double>::Array4<const_double,_0>
                  ((Array4<const_double> *)in_stack_fffffffffffff310,local_488);
        HydroUtils::ComputeFluxes
                  (in_stack_fffffffffffff698,in_stack_fffffffffffff690,in_stack_fffffffffffff688,
                   in_stack_fffffffffffff680,in_stack_fffffffffffff678,in_stack_fffffffffffff670,
                   (Array4<const_double> *)in_stack_fffffffffffff8a0,
                   (Array4<const_double> *)in_stack_fffffffffffff8a8._M_pi,in_stack_fffffffffffff8b0
                   ,(Array4<const_double> *)in_stack_fffffffffffff8b8._M_pi,
                   in_stack_fffffffffffff8c0,in_stack_fffffffffffff8c8,
                   (bool)in_stack_fffffffffffff66f);
        start_comp = (int)((ulong)pAVar7 >> 0x20);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffff310,(MFIter *)in_stack_fffffffffffff308,start_comp);
        amrex::Array4<const_double>::Array4<const_double,_0>
                  ((Array4<const_double> *)&stack0xfffffffffffff790,local_320);
        amrex::Array4<const_double>::Array4<const_double,_0>(&local_8b0,local_368);
        amrex::Array4<const_double>::Array4<const_double,_0>(&local_8f0,local_3b0);
        in_stack_fffffffffffff300 =
             (MFIter *)(CONCAT44(start_comp,(uint)local_72) & 0xffffffff00000001);
        HydroUtils::ComputeDivergence
                  (in_stack_fffffffffffff490,(Array4<double> *)in_stack_fffffffffffff488,
                   in_stack_fffffffffffff480,(Array4<const_double> *)in_stack_fffffffffffff478,fz_00
                   ,ncomp_00,(Geometry *)in_RCX,(Real)mult_00,(bool)uVar10);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffff310,(MFIter *)in_stack_fffffffffffff308,
                   (int)((ulong)in_stack_fffffffffffff300 >> 0x20));
        local_8f8 = local_938;
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffff308,in_stack_fffffffffffff300);
        in_stack_fffffffffffff538 = local_b0;
        memcpy(&stack0xfffffffffffff540,local_3f8,0x3c);
        memcpy(auStack_a80,local_440,0x3c);
        memcpy(auStack_a40,local_488,0x3c);
        memcpy(auStack_a00,local_8f8,0x3c);
        memcpy(auStack_9c0,&stack0xfffffffffffff680,0x3c);
        amrex::
        ParallelFor<int,BDS::ComputeAofs(amrex::MultiFab&,int,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,bool,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::BCRec_const*,amrex::Geometry_const&,amrex::Vector<int,std::allocator<int>>&,double,bool)::__0,void>
                  (in_stack_fffffffffffff350,in_stack_fffffffffffff34c,in_stack_fffffffffffff340);
        amrex::Gpu::streamSynchronize();
        amrex::MFIter::operator++(&local_2f0);
      }
      amrex::MFIter::~MFIter(in_stack_fffffffffffff300);
      amrex::MultiFab::~MultiFab((MultiFab *)0x6c6ac5);
      amrex::PODVector<int,_std::allocator<int>_>::~PODVector
                ((PODVector<int,_std::allocator<int>_> *)in_stack_fffffffffffff300);
      return;
    }
    piVar4 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff300,
                        (size_type)puVar8);
    uVar10 = (undefined1)((uint)in_stack_fffffffffffff324 >> 0x18);
    if (*piVar4 == 0) {
      ppMVar5 = std::array<const_amrex::MultiFab_*,_3UL>::operator[]
                          ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffff300,
                           (size_type)puVar8);
      *ppMVar5 = local_60;
      ppMVar5 = std::array<const_amrex::MultiFab_*,_3UL>::operator[]
                          ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffff300,
                           (size_type)puVar8);
      *ppMVar5 = in_stack_00000008;
      ppMVar5 = std::array<const_amrex::MultiFab_*,_3UL>::operator[]
                          ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffff300,
                           (size_type)puVar8);
      *ppMVar5 = in_stack_00000010;
      amrex::computeDivergence
                ((MultiFab *)in_stack_fffffffffffff550,
                 (Array<const_MultiFab_*,_3> *)
                 CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548),
                 in_stack_fffffffffffff540);
      goto LAB_006c62e2;
    }
    local_278 = local_278 + 1;
  } while( true );
}

Assistant:

void
BDS::ComputeAofs ( MultiFab& aofs,
                   const int aofs_comp,
                   const int ncomp,
                   MultiFab const& state,
                   const int state_comp,
                   AMREX_D_DECL( MultiFab const& umac,
                                 MultiFab const& vmac,
                                 MultiFab const& wmac),
                   AMREX_D_DECL( MultiFab& xedge,
                                 MultiFab& yedge,
                                 MultiFab& zedge),
                   const int  edge_comp,
                   const bool known_edgestate,
                   AMREX_D_DECL( MultiFab& xfluxes,
                                 MultiFab& yfluxes,
                                 MultiFab& zfluxes),
                   int fluxes_comp,
                   MultiFab const& fq,
                   const int fq_comp,
                   MultiFab const& divu,
                   BCRec const* d_bc,
                   Geometry const& geom,
                   Vector<int>& iconserv,
                   const Real dt,
                   const bool is_velocity)
{

    BL_PROFILE("BDS::ComputeAofs()");
    amrex::ignore_unused(divu);

    bool fluxes_are_area_weighted = true;

    // Make a device copy of the iconserv vector for use in kernels
    Gpu::DeviceVector<int> iconserv_d(iconserv.size());
    Gpu::copy(Gpu::hostToDevice, iconserv.begin(), iconserv.end(), iconserv_d.begin());
    int const* iconserv_ptr = iconserv_d.data();

    // If we need convective form, we must also compute div(u_mac)
    MultiFab divu_mac(state.boxArray(),state.DistributionMap(),1,0);;
    for (Long i = 0; i < iconserv.size(); ++i)
    {
        if (!iconserv[i])
        {
            Array<MultiFab const*,AMREX_SPACEDIM> u;
            AMREX_D_TERM(u[0] = &umac;,
                         u[1] = &vmac;,
                         u[2] = &wmac;);
            amrex::computeDivergence(divu_mac,u,geom);

            break;
        }
    }

#if (AMREX_SPACEDIM==2)
    if ( geom.IsRZ() )
    {
        Abort("BDS does not currently support cylindrical coordinates");
    }
#endif

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(aofs,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {

        const Box& bx   = mfi.tilebox();

        //
        // Get handlers to Array4
        //
        AMREX_D_TERM( const auto& fx = xfluxes.array(mfi,fluxes_comp);,
                      const auto& fy = yfluxes.array(mfi,fluxes_comp);,
                      const auto& fz = zfluxes.array(mfi,fluxes_comp););

        AMREX_D_TERM( const auto& xed = xedge.array(mfi,edge_comp);,
                      const auto& yed = yedge.array(mfi,edge_comp);,
                      const auto& zed = zedge.array(mfi,edge_comp););

        AMREX_D_TERM( const auto& u = umac.const_array(mfi);,
                      const auto& v = vmac.const_array(mfi);,
                      const auto& w = wmac.const_array(mfi););

        if ( !known_edgestate ) {
            BDS::ComputeEdgeState( bx, ncomp,
                                   state.array(mfi, state_comp),
                                   AMREX_D_DECL(xed, yed, zed),
                                   AMREX_D_DECL(u, v, w),
                                   divu.array(mfi),
                                   fq.array(mfi, fq_comp),
                                   geom, dt, d_bc, iconserv_ptr,
                                   is_velocity);
        }



        // Compute -div instead of computing div -- this is just for consistency
        // with the way we HAVE to do it for EB (because redistribution operates on
        // -div rather than div)
        Real mult = -1.0;

        HydroUtils::ComputeFluxes( bx,
                                   AMREX_D_DECL( fx, fy, fz ),
                                   AMREX_D_DECL( u, v, w ),
                                   AMREX_D_DECL( xed, yed, zed ),
                                   geom, ncomp, fluxes_are_area_weighted );

        HydroUtils::ComputeDivergence( bx,
                                       aofs.array(mfi,aofs_comp),
                                       AMREX_D_DECL( fx, fy, fz ),
                                       ncomp, geom,
                                       mult, fluxes_are_area_weighted);


        // Compute the convective form if needed and
        // flip the sign to return div
        auto const& aofs_arr  = aofs.array(mfi, aofs_comp);
        auto const& divu_arr  = divu_mac.array(mfi);
        amrex::ParallelFor(bx, ncomp, [=]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            if (!iconserv_ptr[n])
            {
                Real q = xed(i,j,k,n) + xed(i+1,j,k,n)
                       + yed(i,j,k,n) + yed(i,j+1,k,n);
#if (AMREX_SPACEDIM == 2)
                q *= 0.25;
#else
                q += zed(i,j,k,n) + zed(i,j,k+1,n);
                q /= 6.0;
#endif
                aofs_arr(i,j,k,n) += q*divu_arr(i,j,k);
            }

            aofs_arr( i, j, k, n ) *=  - 1.0;
        });

        //
        // NOTE this sync cannot protect temporaries in ComputeEdgeState, ComputeFluxes
        // or ComputeDivergence, since functions have their own scope. As soon as the
        // CPU hits the end of the function, it will call the destructor for all
        // temporaries created in that function.
        //
        Gpu::streamSynchronize();  // otherwise we might be using too much memory
    }

}